

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

Value * __thiscall
ot::commissioner::Interpreter::ProcessConfig
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  Value *pVVar4;
  element_type *peVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar6;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  anon_class_1_0_00000001 local_77a;
  v10 local_779;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_778;
  char *local_770;
  string local_768;
  Error local_748;
  Value local_720;
  int local_6d8;
  ErrorCode local_6d4;
  Error local_6d0;
  Value local_6a8;
  ErrorCode local_65c;
  Error local_658;
  Value local_630;
  char *local_5e8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5e0;
  anon_class_1_0_00000001 local_5d2;
  v10 local_5d1;
  v10 *local_5d0;
  size_t local_5c8;
  string local_5c0;
  Error local_5a0;
  Value local_578;
  undefined1 local_530 [8];
  ByteArray pskc;
  Value local_4f8;
  string local_4b0;
  Value local_490;
  anon_class_1_0_00000001 local_442;
  v10 local_441;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_440;
  char *local_438;
  string local_430;
  Error local_410;
  Value local_3e8;
  anon_class_1_0_00000001 local_38a;
  v10 local_389;
  v10 *local_388;
  size_t local_380;
  string local_378;
  Error local_358;
  Value local_330;
  byte local_2e1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_2e0;
  Expression *aExpr_local;
  Interpreter *this_local;
  Value *value;
  undefined1 local_2b0 [16];
  v10 *local_2a0;
  ulong local_298;
  v10 *local_290;
  size_t sStack_288;
  string *local_280;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_278 [3];
  undefined1 local_260 [16];
  v10 *local_250;
  ulong local_248;
  v10 *local_240;
  size_t sStack_238;
  string *local_230;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_228 [2];
  undefined1 local_218 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_208;
  char *local_200;
  const_reference local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f0;
  char *pcStack_1e8;
  string *local_1e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1d8 [3];
  undefined1 local_1c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b0;
  char *local_1a8;
  const_reference local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_198;
  char *pcStack_190;
  string *local_188;
  v10 *local_180;
  v10 **local_178;
  v10 *local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_168;
  v10 *local_160;
  v10 **local_158;
  v10 *local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_148;
  v10 **local_140;
  v10 *local_138;
  size_t sStack_130;
  v10 **local_120;
  v10 *local_118;
  size_t sStack_110;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_100;
  undefined1 *local_f8;
  Value **local_f0;
  undefined1 *local_e8;
  Value **local_e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_d8;
  Value **local_d0;
  undefined8 local_c8;
  undefined1 *local_c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_b8;
  undefined8 local_b0;
  undefined1 *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  char *pcStack_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  char *pcStack_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_68;
  undefined1 *local_60;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_58;
  undefined8 local_50;
  undefined1 *local_48;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_40;
  undefined1 *local_38;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_30;
  undefined8 local_28;
  undefined1 *local_20;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_10;
  
  local_2e1 = 0;
  local_2e0 = aExpr;
  aExpr_local = (Expression *)this;
  this_local = (Interpreter *)__return_storage_ptr__;
  Value::Value(__return_storage_ptr__);
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(local_2e0);
  if (sVar2 < 3) {
    ProcessConfig::anon_class_1_0_00000001::operator()(&local_38a);
    local_178 = &local_388;
    local_180 = &local_389;
    bVar6 = ::fmt::v10::operator()(local_180);
    local_380 = bVar6.size_;
    local_388 = (v10 *)bVar6.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_230 = &local_378;
    local_240 = local_388;
    sStack_238 = local_380;
    local_140 = &local_240;
    local_250 = local_388;
    local_248 = local_380;
    local_138 = local_250;
    sStack_130 = local_248;
    local_278[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_f8 = local_260;
    local_100 = local_278;
    local_b0 = 0;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_248;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_100;
    local_d8 = local_100;
    local_b8 = local_100;
    local_a8 = local_f8;
    ::fmt::v10::vformat_abi_cxx11_(&local_378,local_250,fmt,args);
    Error::Error(&local_358,kInvalidArgs,&local_378);
    Value::Value(&local_330,&local_358);
    Value::operator=(__return_storage_ptr__,&local_330);
    Value::~Value(&local_330);
    Error::~Error(&local_358);
    std::__cxx11::string::~string((string *)&local_378);
  }
  else {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_2e0,2);
    bVar1 = std::operator==(pvVar3,"pskc");
    if (!bVar1) {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_2e0,2);
      bVar1 = std::operator==(pvVar3,"admincode");
      if (!bVar1) {
        ProcessConfig::anon_class_1_0_00000001::operator()(&local_442);
        local_168 = &local_440;
        local_170 = &local_441;
        bVar6 = ::fmt::v10::operator()(local_170);
        local_438 = (char *)bVar6.size_;
        local_440 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar6.data_
        ;
        ::fmt::v10::detail::
        check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                  ();
        local_1a0 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[](local_2e0,2);
        local_188 = &local_430;
        local_198 = local_440;
        pcStack_190 = local_438;
        local_a0 = &local_198;
        local_1b0 = local_440;
        local_1a8 = local_438;
        local_98 = local_1b0;
        pcStack_90 = local_1a8;
        local_1d8[0] = ::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                                 ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_1a0,(v10 *)local_188,local_440);
        local_60 = local_1c0;
        local_68 = local_1d8;
        local_50 = 0xd;
        fmt_00.size_ = 0xd;
        fmt_00.data_ = local_1a8;
        args_00.field_1.values_ = in_R9.values_;
        args_00.desc_ = (unsigned_long_long)local_68;
        local_58 = local_68;
        local_48 = local_60;
        local_10 = local_68;
        ::fmt::v10::vformat_abi_cxx11_(&local_430,(v10 *)local_1b0,fmt_00,args_00);
        Error::Error(&local_410,kInvalidArgs,&local_430);
        Value::Value(&local_3e8,&local_410);
        Value::operator=(__return_storage_ptr__,&local_3e8);
        Value::~Value(&local_3e8);
        Error::~Error(&local_410);
        std::__cxx11::string::~string((string *)&local_430);
        goto LAB_0023aa41;
      }
    }
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_2e0,1);
    bVar1 = std::operator==(pvVar3,"get");
    if (bVar1) {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_2e0,2);
      bVar1 = std::operator==(pvVar3,"admincode");
      if (bVar1) {
        std::__cxx11::string::string
                  ((string *)&local_4b0,(string *)&this->mThreadAdministratorPasscode);
        Value::Value(&local_490,&local_4b0);
        Value::operator=(__return_storage_ptr__,&local_490);
        Value::~Value(&local_490);
        std::__cxx11::string::~string((string *)&local_4b0);
      }
      else {
        peVar5 = std::
                 __shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->mJobManager);
        JobManager::GetDefaultConfigPSKc_abi_cxx11_
                  ((string *)
                   &pskc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,peVar5);
        Value::Value(&local_4f8,
                     (string *)
                     &pskc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage);
        Value::operator=(__return_storage_ptr__,&local_4f8);
        Value::~Value(&local_4f8);
        std::__cxx11::string::~string
                  ((string *)
                   &pskc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      }
    }
    else {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_2e0,1);
      bVar1 = std::operator==(pvVar3,"set");
      if (bVar1) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_530);
        sVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(local_2e0);
        if (sVar2 < 4) {
          ProcessConfig::anon_class_1_0_00000001::operator()(&local_5d2);
          local_158 = &local_5d0;
          local_160 = &local_5d1;
          bVar6 = ::fmt::v10::operator()(local_160);
          local_5c8 = bVar6.size_;
          local_5d0 = (v10 *)bVar6.data_;
          ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
          local_280 = &local_5c0;
          local_290 = local_5d0;
          sStack_288 = local_5c8;
          local_120 = &local_290;
          local_2a0 = local_5d0;
          local_298 = local_5c8;
          local_118 = local_2a0;
          sStack_110 = local_298;
          value = (Value *)::fmt::v10::
                           make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                     ();
          local_e8 = local_2b0;
          local_f0 = &value;
          local_c8 = 0;
          fmt_01.size_ = 0;
          fmt_01.data_ = (char *)local_298;
          args_01.field_1.values_ = in_R9.values_;
          args_01.desc_ = (unsigned_long_long)local_f0;
          local_e0 = local_f0;
          local_d0 = local_f0;
          local_c0 = local_e8;
          ::fmt::v10::vformat_abi_cxx11_(&local_5c0,local_2a0,fmt_01,args_01);
          Error::Error(&local_5a0,kInvalidArgs,&local_5c0);
          Value::Value(&local_578,&local_5a0);
          Value::operator=(__return_storage_ptr__,&local_578);
          Value::~Value(&local_578);
          Error::~Error(&local_5a0);
          std::__cxx11::string::~string((string *)&local_5c0);
          local_6d8 = 4;
        }
        else {
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](local_2e0,2);
          bVar1 = std::operator==(pvVar3,"admincode");
          if (bVar1) {
            pvVar3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](local_2e0,3);
            std::__cxx11::string::operator=
                      ((string *)&this->mThreadAdministratorPasscode,(string *)pvVar3);
            local_5e0._M_current = (char *)std::__cxx11::string::begin();
            local_5e8 = (char *)std::__cxx11::string::end();
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            assign<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_530,local_5e0,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )local_5e8);
          }
          else {
            pvVar3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](local_2e0,3);
            utils::Hex(&local_658,(ByteArray *)local_530,pvVar3);
            Value::Value(&local_630,&local_658);
            pVVar4 = Value::operator=(__return_storage_ptr__,&local_630);
            local_65c = kNone;
            bVar1 = Value::operator!=(pVVar4,&local_65c);
            Value::~Value(&local_630);
            Error::~Error(&local_658);
            if (bVar1) {
              local_6d8 = 4;
              goto LAB_0023a7b7;
            }
          }
          peVar5 = std::
                   __shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&this->mJobManager);
          JobManager::UpdateDefaultConfigPSKc(&local_6d0,peVar5,(ByteArray *)local_530);
          Value::Value(&local_6a8,&local_6d0);
          pVVar4 = Value::operator=(__return_storage_ptr__,&local_6a8);
          local_6d4 = kNone;
          bVar1 = Value::operator!=(pVVar4,&local_6d4);
          Value::~Value(&local_6a8);
          Error::~Error(&local_6d0);
          if (bVar1) {
            local_6d8 = 4;
          }
          else {
            local_6d8 = 0;
          }
        }
LAB_0023a7b7:
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_530);
        if ((local_6d8 != 0) && (local_6d8 != 4)) goto LAB_0023aa52;
      }
      else {
        ProcessConfig::anon_class_1_0_00000001::operator()(&local_77a);
        local_148 = &local_778;
        local_150 = &local_779;
        bVar6 = ::fmt::v10::operator()(local_150);
        local_770 = (char *)bVar6.size_;
        local_778 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar6.data_
        ;
        ::fmt::v10::detail::
        check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                  ();
        local_1f8 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[](local_2e0,1);
        local_1e0 = &local_768;
        local_1f0 = local_778;
        pcStack_1e8 = local_770;
        local_80 = &local_1f0;
        local_208 = local_778;
        local_200 = local_770;
        local_78 = local_208;
        pcStack_70 = local_200;
        local_228[0] = ::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                                 ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_1f8,(v10 *)local_1e0,local_778);
        local_38 = local_218;
        local_40 = local_228;
        local_28 = 0xd;
        fmt_02.size_ = 0xd;
        fmt_02.data_ = local_200;
        args_02.field_1.values_ = in_R9.values_;
        args_02.desc_ = (unsigned_long_long)local_40;
        local_30 = local_40;
        local_20 = local_38;
        local_18 = local_40;
        ::fmt::v10::vformat_abi_cxx11_(&local_768,(v10 *)local_208,fmt_02,args_02);
        Error::Error(&local_748,kInvalidCommand,&local_768);
        Value::Value(&local_720,&local_748);
        Value::operator=(__return_storage_ptr__,&local_720);
        Value::~Value(&local_720);
        Error::~Error(&local_748);
        std::__cxx11::string::~string((string *)&local_768);
      }
    }
  }
LAB_0023aa41:
  local_2e1 = 1;
  local_6d8 = 1;
LAB_0023aa52:
  if ((local_2e1 & 1) == 0) {
    Value::~Value(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessConfig(const Expression &aExpr)
{
    Value value;

    VerifyOrExit(aExpr.size() >= 3, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
    VerifyOrExit(aExpr[2] == "pskc" || aExpr[2] == "admincode",
                 value = ERROR_INVALID_ARGS("{} is not a valid property", aExpr[2]));
    if (aExpr[1] == "get")
    {
        if (aExpr[2] == "admincode")
        {
            ExitNow(value = mThreadAdministratorPasscode);
        }

        value = mJobManager->GetDefaultConfigPSKc();
    }
    else if (aExpr[1] == "set")
    {
        ByteArray pskc;

        VerifyOrExit(aExpr.size() >= 4, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
        if (aExpr[2] == "admincode")
        {
            mThreadAdministratorPasscode = aExpr[3];

            // TODO(rongli@): add len and last digit check per SPEC-1216v11
            pskc.assign(mThreadAdministratorPasscode.begin(), mThreadAdministratorPasscode.end());
        }
        else
        {
            SuccessOrExit(value = utils::Hex(pskc, aExpr[3]));
        }
        SuccessOrExit(value = mJobManager->UpdateDefaultConfigPSKc(pskc));
    }
    else
    {
        ExitNow(value = ERROR_INVALID_COMMAND(SYNTAX_INVALID_SUBCOMMAND, aExpr[1]));
    }

exit:
    return value;
}